

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

size_t __thiscall
DSectorPlaneInterpolation::PointerSubstitution
          (DSectorPlaneInterpolation *this,DObject *old,DObject *notOld)

{
  uint uVar1;
  DInterpolation **ppDVar2;
  uint i;
  ulong uVar3;
  int iVar4;
  
  uVar1 = (this->attached).Count;
  iVar4 = 0;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    ppDVar2 = (this->attached).Array;
    if (ppDVar2[uVar3] == (DInterpolation *)old) {
      ppDVar2[uVar3] = (DInterpolation *)notOld;
      iVar4 = iVar4 + 1;
    }
  }
  return (long)iVar4;
}

Assistant:

size_t DSectorPlaneInterpolation::PointerSubstitution (DObject *old, DObject *notOld)
{
	int subst = 0;
	for(unsigned i=0; i<attached.Size(); i++)
	{
		if (attached[i] == old) 
		{
			attached[i] = (DInterpolation*)notOld;
			subst++;
		}
	}
	return subst;
}